

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

econf_err find_key(econf_file key_file,char *group,char *key,size_t *num)

{
  int iVar1;
  char *local_48;
  ulong local_38;
  size_t i;
  char *grp;
  size_t *num_local;
  char *key_local;
  char *group_local;
  
  if ((group == (char *)0x0) || (*group == '\0')) {
    local_48 = strdup("_none_");
  }
  else {
    local_48 = strdup(group);
  }
  if (local_48 == (char *)0x0) {
    group_local._4_4_ = ECONF_NOMEM;
  }
  else if ((key == (char *)0x0) || (*key == '\0')) {
    free(local_48);
    group_local._4_4_ = ECONF_ERROR;
  }
  else {
    for (local_38 = 0; local_38 < key_file.length; local_38 = local_38 + 1) {
      iVar1 = strcmp(key_file.file_entry[local_38].group,local_48);
      if ((iVar1 == 0) && (iVar1 = strcmp(key_file.file_entry[local_38].key,key), iVar1 == 0)) {
        free(local_48);
        *num = local_38;
        return ECONF_SUCCESS;
      }
    }
    free(local_48);
    group_local._4_4_ = ECONF_NOKEY;
  }
  return group_local._4_4_;
}

Assistant:

econf_err find_key(econf_file key_file, const char *group, const char *key, size_t *num) {
	char *grp = (!group || !*group) ? strdup(KEY_FILE_NULL_VALUE) : strdup(group);
  if (grp == NULL)
    return  ECONF_NOMEM;
  if (!key || !*key) {
    free(grp);
    return ECONF_ERROR;
  }
  for (size_t i = 0; i < key_file.length; i++) {
    if (!strcmp(key_file.file_entry[i].group, grp) &&
        !strcmp(key_file.file_entry[i].key, key)) {
      free(grp);
      *num = i;
      return ECONF_SUCCESS;
    }
  }
  // Key not found
  free(grp);
  return ECONF_NOKEY;
}